

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t lzx_read_bitlen(lzx_stream *strm,huffman *d,wchar_t end)

{
  lzx_dec *plVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  lzx_br *br_00;
  int iVar4;
  uint rbits;
  wchar_t same;
  wchar_t ret;
  wchar_t j;
  wchar_t i;
  wchar_t c;
  lzx_br *br;
  lzx_dec *ds;
  wchar_t end_local;
  huffman *d_local;
  lzx_stream *strm_local;
  
  plVar1 = strm->ds;
  br_00 = &plVar1->br;
  ret = plVar1->loop;
  if (ret == L'\0') {
    memset(d->freq,0,0x44);
  }
  rbits = 0;
  ds._4_4_ = end;
  if (end < L'\0') {
    ds._4_4_ = d->len_size;
  }
  while (ret < ds._4_4_) {
    plVar1->loop = ret;
    if ((((plVar1->br).cache_avail < (plVar1->pt).max_bits) &&
        (wVar2 = lzx_br_fillup(strm,br_00), wVar2 == L'\0')) &&
       ((plVar1->br).cache_avail < (plVar1->pt).max_bits)) goto LAB_00688465;
    wVar2 = (plVar1->pt).max_bits;
    wVar2 = lzx_decode_huffman(&plVar1->pt,
                               (uint)(br_00->cache_buffer >>
                                     ((char)(plVar1->br).cache_avail - (char)wVar2 & 0x3fU)) &
                               cache_masks[wVar2]);
    if (wVar2 == L'\x11') {
      if ((((plVar1->br).cache_avail < (uint)(plVar1->pt).bitlen[0x11] + L'\x04') &&
          (wVar2 = lzx_br_fillup(strm,br_00), wVar2 == L'\0')) &&
         ((plVar1->br).cache_avail < (uint)(plVar1->pt).bitlen[0x11] + L'\x04')) goto LAB_00688465;
      (plVar1->br).cache_avail = (plVar1->br).cache_avail - (uint)(plVar1->pt).bitlen[0x11];
      wVar2 = ((uint)(br_00->cache_buffer >> ((char)(plVar1->br).cache_avail - 4U & 0x3f)) & 0xf) +
              L'\x04';
      if (ds._4_4_ < ret + wVar2) {
        return L'\xffffffff';
      }
      (plVar1->br).cache_avail = (plVar1->br).cache_avail + L'\xfffffffc';
      for (same = L'\0'; same < wVar2; same = same + L'\x01') {
        d->bitlen[ret] = '\0';
        ret = ret + L'\x01';
      }
    }
    else if (wVar2 == L'\x12') {
      if ((((plVar1->br).cache_avail < (uint)(plVar1->pt).bitlen[0x12] + L'\x05') &&
          (wVar2 = lzx_br_fillup(strm,br_00), wVar2 == L'\0')) &&
         ((plVar1->br).cache_avail < (uint)(plVar1->pt).bitlen[0x12] + L'\x05')) goto LAB_00688465;
      (plVar1->br).cache_avail = (plVar1->br).cache_avail - (uint)(plVar1->pt).bitlen[0x12];
      iVar4 = ((uint)(br_00->cache_buffer >> ((char)(plVar1->br).cache_avail - 5U & 0x3f)) & 0x1f) +
              0x14;
      if (ds._4_4_ < ret + iVar4) {
        return L'\xffffffff';
      }
      (plVar1->br).cache_avail = (plVar1->br).cache_avail + L'\xfffffffb';
      memset(d->bitlen + ret,0,(long)iVar4);
      ret = iVar4 + ret;
    }
    else if (wVar2 == L'\x13') {
      if ((((plVar1->br).cache_avail < (plVar1->pt).bitlen[0x13] + 1 + (plVar1->pt).max_bits) &&
          (wVar2 = lzx_br_fillup(strm,br_00), wVar2 == L'\0')) &&
         ((plVar1->br).cache_avail < (plVar1->pt).bitlen[0x13] + 1 + (plVar1->pt).max_bits))
      goto LAB_00688465;
      (plVar1->br).cache_avail = (plVar1->br).cache_avail - (uint)(plVar1->pt).bitlen[0x13];
      wVar2 = ((uint)(br_00->cache_buffer >> ((char)(plVar1->br).cache_avail - 1U & 0x3f)) & 1) +
              L'\x04';
      if (ds._4_4_ < ret + wVar2) {
        return L'\xffffffff';
      }
      (plVar1->br).cache_avail = (plVar1->br).cache_avail + L'\xffffffff';
      wVar3 = lzx_decode_huffman(&plVar1->pt,
                                 (uint)(br_00->cache_buffer >>
                                       ((char)(plVar1->br).cache_avail - (char)(plVar1->pt).max_bits
                                       & 0x3fU)) & cache_masks[(plVar1->pt).max_bits]);
      (plVar1->br).cache_avail = (plVar1->br).cache_avail - (uint)(plVar1->pt).bitlen[wVar3];
      iVar4 = (((uint)d->bitlen[ret] - wVar3) + 0x11) % 0x11;
      if (iVar4 < 0) {
        return L'\xffffffff';
      }
      for (same = L'\0'; same < wVar2; same = same + L'\x01') {
        d->bitlen[ret] = (uchar)iVar4;
        ret = ret + L'\x01';
      }
      d->freq[iVar4] = wVar2 + d->freq[iVar4];
    }
    else {
      (plVar1->br).cache_avail = (plVar1->br).cache_avail - (uint)(plVar1->pt).bitlen[wVar2];
      iVar4 = (((uint)d->bitlen[ret] - wVar2) + 0x11) % 0x11;
      if (iVar4 < 0) {
        return L'\xffffffff';
      }
      d->freq[iVar4] = d->freq[iVar4] + L'\x01';
      d->bitlen[ret] = (uchar)iVar4;
      ret = ret + L'\x01';
    }
  }
  rbits = 1;
LAB_00688465:
  plVar1->loop = ret;
  return rbits;
}

Assistant:

static int
lzx_read_bitlen(struct lzx_stream *strm, struct huffman *d, int end)
{
	struct lzx_dec *ds = strm->ds;
	struct lzx_br *br = &(ds->br);
	int c, i, j, ret, same;
	unsigned rbits;

	i = ds->loop;
	if (i == 0)
		memset(d->freq, 0, sizeof(d->freq));
	ret = 0;
	if (end < 0)
		end = d->len_size;
	while (i < end) {
		ds->loop = i;
		if (!lzx_br_read_ahead(strm, br, ds->pt.max_bits))
			goto getdata;
		rbits = lzx_br_bits(br, ds->pt.max_bits);
		c = lzx_decode_huffman(&(ds->pt), rbits);
		switch (c) {
		case 17:/* several zero lengths, from 4 to 19. */
			if (!lzx_br_read_ahead(strm, br, ds->pt.bitlen[c]+4))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 4) + 4;
			if (i + same > end)
				return (-1);/* Invalid */
			lzx_br_consume(br, 4);
			for (j = 0; j < same; j++)
				d->bitlen[i++] = 0;
			break;
		case 18:/* many zero lengths, from 20 to 51. */
			if (!lzx_br_read_ahead(strm, br, ds->pt.bitlen[c]+5))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 5) + 20;
			if (i + same > end)
				return (-1);/* Invalid */
			lzx_br_consume(br, 5);
			memset(d->bitlen + i, 0, same);
			i += same;
			break;
		case 19:/* a few same lengths. */
			if (!lzx_br_read_ahead(strm, br,
			    ds->pt.bitlen[c]+1+ds->pt.max_bits))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 1) + 4;
			if (i + same > end)
				return (-1);
			lzx_br_consume(br, 1);
			rbits = lzx_br_bits(br, ds->pt.max_bits);
			c = lzx_decode_huffman(&(ds->pt), rbits);
			lzx_br_consume(br, ds->pt.bitlen[c]);
			c = (d->bitlen[i] - c + 17) % 17;
			if (c < 0)
				return (-1);/* Invalid */
			for (j = 0; j < same; j++)
				d->bitlen[i++] = c;
			d->freq[c] += same;
			break;
		default:
			lzx_br_consume(br, ds->pt.bitlen[c]);
			c = (d->bitlen[i] - c + 17) % 17;
			if (c < 0)
				return (-1);/* Invalid */
			d->freq[c]++;
			d->bitlen[i++] = c;
			break;
		}
	}
	ret = 1;
getdata:
	ds->loop = i;
	return (ret);
}